

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_oh_erase_item(qpdf_data qpdf,qpdf_oh oh,int at)

{
  anon_class_4_1_3fcf64f1 local_3c;
  function<void_(QPDFObjectHandle_&)> local_38;
  int local_18;
  qpdf_oh local_14;
  int at_local;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_3c.at = at;
  local_18 = at;
  local_14 = oh;
  _at_local = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_oh_erase_item::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_38,&local_3c);
  do_with_oh_void(qpdf,oh,&local_38);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_38);
  return;
}

Assistant:

void
qpdf_oh_erase_item(qpdf_data qpdf, qpdf_oh oh, int at)
{
    do_with_oh_void(qpdf, oh, [at](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_erase_item");
        o.eraseItem(at);
    });
}